

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O3

void test_bhdct_delete_all_string_key(planck_unit_test_t *tc)

{
  uint uVar1;
  ulong uVar2;
  char key [9];
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  char local_a0 [16];
  ion_dictionary_t local_90;
  ion_dictionary_handler_t local_78;
  
  local_a0[8] = 0;
  local_a0[0] = '\0';
  local_a0[1] = '\0';
  local_a0[2] = '\0';
  local_a0[3] = '\0';
  local_a0[4] = '\0';
  local_a0[5] = '\0';
  local_a0[6] = '\0';
  local_a0[7] = '\0';
  bhdct_setup_string_key(tc,&local_78,&local_90,ion_fill_edge_cases);
  uVar2 = 0;
  do {
    sprintf(local_a0,"k%d",uVar2);
    bhdct_delete(tc,&local_90,local_a0,'\0',1,'\x01');
    uVar1 = (int)uVar2 + 1;
    uVar2 = (ulong)uVar1;
  } while (uVar1 != 10);
  uVar1 = 0x30;
  do {
    uVar1 = uVar1 + 2;
    sprintf(local_a0,"k%d",(ulong)uVar1);
    bhdct_delete(tc,&local_90,local_a0,'\0',1,'\x01');
  } while (uVar1 < 0x62);
  uVar1 = 0x1ef;
  do {
    uVar1 = uVar1 + 5;
    sprintf(local_a0,"k%d",(ulong)uVar1);
    bhdct_delete(tc,&local_90,local_a0,'\0',1,'\x01');
  } while (uVar1 < 0x3e3);
  uVar1 = 0xffffff9a;
  do {
    uVar1 = uVar1 + 2;
    sprintf(local_a0,"k%d",(ulong)uVar1);
    bhdct_delete(tc,&local_90,local_a0,'\0',1,'\x01');
  } while (uVar1 < 0xffffffcc);
  bhdct_delete_dictionary(tc,&local_90);
  bhdct_close_master_table(tc);
  bhdct_delete_master_table(tc);
  return;
}

Assistant:

void
test_bhdct_delete_all_string_key(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;
	char						key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	bhdct_setup_string_key(tc, &handler, &dict, ion_fill_edge_cases);

	int i;

	ION_FILL_LOW_LOOP(i) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_delete(tc, &dict, key, err_ok, 1, boolean_true);
	}
	ION_FILL_MEDIUM_LOOP(i) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_delete(tc, &dict, key, err_ok, 1, boolean_true);
	}
	ION_FILL_HIGH_LOOP(i) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_delete(tc, &dict, key, err_ok, 1, boolean_true);
	}
	ION_FILL_EDGE_LOOP(i) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_delete(tc, &dict, key, err_ok, 1, boolean_true);
	}

	bhdct_takedown(tc, &dict);
}